

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobj.cpp
# Opt level: O0

void test_receive_proc(Am_Connection *my_connection_ptr)

{
  ostream *poVar1;
  void *pvVar2;
  ulong uVar3;
  Am_Object local_38;
  Am_Object sent_obj;
  Am_Value local_20 [8];
  Am_Value val;
  Am_Connection *my_connection_ptr_local;
  
  Am_Connection::Receive();
  poVar1 = std::operator<<((ostream *)&std::cout,"testnobj:Received ");
  pvVar2 = (void *)operator<<(poVar1,local_20);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  Am_Object::Am_Object(&local_38,local_20);
  uVar3 = Am_Object::Get((ushort)&local_38,0x65);
  Am_Object::Set(0x6218,(Am_Value *)0x65,uVar3);
  uVar3 = Am_Object::Get((ushort)&local_38,100);
  Am_Object::Set(0x6218,(Am_Value *)0x64,uVar3);
  Am_Object::~Am_Object(&local_38);
  Am_Value::~Am_Value(local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Receive_Method, void, test_receive,
                 (Am_Connection * my_connection_ptr))
{
  Am_Value val = my_connection_ptr->Receive();
  cout << "testnobj:Received " << val << endl << flush;

  Am_Object sent_obj = (Am_Object)val;
  rectangle.Set(Am_TOP, sent_obj.Get(Am_TOP));
  rectangle.Set(Am_LEFT, sent_obj.Get(Am_LEFT));
}